

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

void __thiscall
pbrt::LightPathIntegrator::EvaluatePixelSample
          (LightPathIntegrator *this,Point2i pPixel,int sampleIndex,SamplerHandle *sampler,
          ScratchBuffer *scratchBuffer)

{
  CameraHandle *this_00;
  Vector3f *pVVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Tuple2<pbrt::Point2,_float> uv;
  BxDFFlags flags;
  PowerLightSampler *this_01;
  undefined1 auVar6 [16];
  undefined4 uVar7;
  undefined8 uVar8;
  anon_class_24_3_20c75c41 func;
  Tuple3<pbrt::Vector3,_float> TVar9;
  Tuple3<pbrt::Vector3,_float> woRender;
  bool bVar10;
  int iVar11;
  SampledLight *pSVar12;
  ulong uVar13;
  LightLeSample *pLVar14;
  Interaction *pIVar15;
  CameraWiSample *pCVar16;
  CameraWiSample *pCVar17;
  LightLeSample *this_02;
  ShapeIntersection *this_03;
  BSDFSample *pBVar18;
  BSDFSample *pBVar19;
  ShapeIntersection *pSVar20;
  undefined4 in_register_00000014;
  int iVar21;
  byte bVar22;
  Float FVar23;
  Float a;
  type tVar24;
  Point2f PVar25;
  Point2f u2;
  ulong extraout_XMM0_Qb;
  undefined1 auVar39 [56];
  undefined1 extraout_var [56];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar53 [56];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  SampledSpectrum SVar54;
  SampledSpectrum SVar55;
  Point3f p;
  Normal3f n;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_4d0;
  undefined1 local_4c8 [16];
  SampledWavelengths lambda;
  optional<pbrt::BSDFSample> bs;
  ulong uStack_460;
  undefined1 local_448 [12];
  undefined1 auStack_43c [8];
  float fStack_434;
  Float FStack_430;
  MediumHandle local_428;
  uint local_420;
  float fStack_41c;
  undefined8 uStack_418;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float fStack_400;
  undefined8 uStack_3fc;
  undefined8 uStack_3f4;
  SampledSpectrum local_3e0;
  uintptr_t local_3d0;
  CameraHandle local_3c8;
  optional<pbrt::SampledLight> sampledLight;
  SampledSpectrum beta;
  RayDifferential local_398;
  Interval local_338;
  Interval IStack_330;
  Interval IStack_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  SampledSpectrum local_300;
  SampledSpectrum local_2f0;
  optional<pbrt::LightLeSample> les;
  BSDF bsdf;
  SampledSpectrum Le;
  bool local_140;
  optional<pbrt::CameraWiSample> cs;
  bool local_38;
  undefined1 auVar26 [64];
  undefined1 auVar40 [64];
  
  FVar23 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler,pPixel.super_Tuple2<pbrt::Point2,_int>,
                      CONCAT44(in_register_00000014,sampleIndex));
  SampledWavelengths::SampleXYZ
            (&lambda,(Float)((uint)(*(byte *)(Options + 6) & 1) * 0x3f000000 +
                            (uint)!(bool)(*(byte *)(Options + 6) & 1) * (int)FVar23));
  this_01 = (this->lightSampler)._M_t.
            super___uniq_ptr_impl<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_>
            ._M_t.
            super__Tuple_impl<0UL,_pbrt::PowerLightSampler_*,_std::default_delete<pbrt::PowerLightSampler>_>
            .super__Head_base<0UL,_pbrt::PowerLightSampler_*,_false>._M_head_impl;
  FVar23 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
  PowerLightSampler::Sample(&sampledLight,this_01,FVar23);
  if (sampledLight.set == true) {
    pSVar12 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
    local_4d0.bits =
         (pSVar12->light).
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits;
    pSVar12 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
    fVar2 = pSVar12->pdf;
    FVar23 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
             ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                         *)sampler);
    this_00 = &(this->super_ImageTileIntegrator).camera;
    uVar13 = (this_00->
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             ).bits & 0xffffffffffff;
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(FVar23 * *(float *)(uVar13 + 0x33c))),
                             ZEXT416((uint)(1.0 - FVar23)),ZEXT416(*(uint *)(uVar13 + 0x338)));
    PVar25 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
             ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                         *)sampler);
    u2 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
         ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                   ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                     *)sampler);
    LightHandle::SampleLe(&les,(LightHandle *)&local_4d0,PVar25,u2,&lambda,auVar6._0_4_);
    if (les.set == true) {
      pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
      if ((pLVar14->pdfPos != 0.0) || (NAN(pLVar14->pdfPos))) {
        pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
        if ((pLVar14->pdfDir != 0.0) || (NAN(pLVar14->pdfDir))) {
          pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
          bVar10 = SampledSpectrum::operator_cast_to_bool(&pLVar14->L);
          if (bVar10) {
            pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
            if ((pLVar14->intr).set == true) {
              pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
              pIVar15 = pstd::optional<pbrt::Interaction>::value(&pLVar14->intr);
              PVar25 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                                 ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                   *)sampler);
              CameraHandle::SampleWi(&cs,this_00,pIVar15,PVar25,&lambda);
              if (cs.set == true) {
                pCVar16 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
                if ((pCVar16->pdf != 0.0) || (NAN(pCVar16->pdf))) {
                  pCVar16 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
                  IStack_328 = (pCVar16->pLens).pi.super_Point3<pbrt::Interval>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                  local_338 = (pCVar16->pLens).pi.super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                  IStack_330 = (pCVar16->pLens).pi.super_Point3<pbrt::Interval>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                  uStack_310 = 0;
                  uStack_320 = 0;
                  uStack_318 = SUB168(ZEXT816(0),4);
                  pCVar16 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
                  local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ =
                       *(undefined8 *)&(pCVar16->wi).super_Tuple3<pbrt::Vector3,_float>;
                  local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
                       (pCVar16->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                  Le.values.values[2] = IStack_330.low;
                  Le.values.values[3] = IStack_330.high;
                  Le.values.values[0] = local_338.low;
                  Le.values.values[1] = local_338.high;
                  local_448._0_8_ = &Le;
                  unique0x00005300 = &bsdf;
                  unique0x00005300 = (TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> *)&local_398;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                  .bits._0_4_ = 1;
                  func.wi = (Vector3f *)unique0x00005300;
                  func.ctx = (LightSampleContext *)local_448._0_8_;
                  func.mode = (LightSamplingMode *)unique0x00005300;
                  FVar23 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                           ::
                           Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                                     ((TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                                       *)&local_4d0,func);
                  if (0.0 < FVar23) {
                    uVar13 = extraout_XMM0_Qb;
                    pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
                    pIVar15 = pstd::optional<pbrt::Interaction>::value(&pLVar14->intr);
                    p = Interaction::p(pIVar15);
                    pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
                    pIVar15 = pstd::optional<pbrt::Interaction>::value(&pLVar14->intr);
                    uVar4 = (pIVar15->n).super_Tuple3<pbrt::Normal3,_float>.x;
                    uVar5 = (pIVar15->n).super_Tuple3<pbrt::Normal3,_float>.y;
                    n.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar5;
                    n.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar4;
                    local_4c8._0_4_ = (pIVar15->n).super_Tuple3<pbrt::Normal3,_float>.z;
                    pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
                    pIVar15 = pstd::optional<pbrt::Interaction>::value(&pLVar14->intr);
                    uv = (pIVar15->uv).super_Tuple2<pbrt::Point2,_float>;
                    pCVar16 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
                    auVar53 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                    auVar39 = ZEXT856(uVar13);
                    n.super_Tuple3<pbrt::Normal3,_float>.z = (float)local_4c8._0_4_;
                    SVar54 = LightHandle::L((LightHandle *)&local_4d0,p,n,(Point2f)uv,
                                            (Vector3f)
                                            (pCVar16->wi).super_Tuple3<pbrt::Vector3,_float>,&lambda
                                           );
                    auVar40._0_8_ = SVar54.values.values._8_8_;
                    auVar40._8_56_ = auVar53;
                    auVar26._0_8_ = SVar54.values.values._0_8_;
                    auVar26._8_56_ = auVar39;
                    Le.values.values = (array<float,_4>)vmovlhps_avx(auVar26._0_16_,auVar40._0_16_);
                    bVar10 = SampledSpectrum::operator_cast_to_bool(&Le);
                    if (bVar10) {
                      pCVar16 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
                      pCVar17 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
                      bVar10 = Integrator::Unoccluded
                                         ((Integrator *)this,&pCVar16->pRef,&pCVar17->pLens);
                      if (bVar10) {
                        pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
                        pCVar16 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
                        a = LightLeSample::AbsCosTheta(pLVar14,&pCVar16->wi);
                        auVar39 = extraout_var;
                        SVar54 = SampledSpectrum::operator*(&Le,a);
                        auVar41._0_8_ = SVar54.values.values._8_8_;
                        auVar41._8_56_ = auVar53;
                        auVar27._0_8_ = SVar54.values.values._0_8_;
                        auVar27._8_56_ = auVar39;
                        auVar6 = vmovlhps_avx(auVar27._0_16_,auVar41._0_16_);
                        auVar39 = ZEXT856(auVar6._8_8_);
                        local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar6._0_8_
                        ;
                        local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = auVar6._8_4_;
                        local_398.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar6._12_4_;
                        pCVar16 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
                        SVar54 = SampledSpectrum::operator*
                                           ((SampledSpectrum *)&local_398,&pCVar16->Wi);
                        auVar42._0_8_ = SVar54.values.values._8_8_;
                        auVar42._8_56_ = auVar53;
                        auVar28._0_8_ = SVar54.values.values._0_8_;
                        auVar28._8_56_ = auVar39;
                        auVar6 = vmovlhps_avx(auVar28._0_16_,auVar42._0_16_);
                        local_448._0_8_ = auVar6._0_8_;
                        local_448._8_4_ = auVar6._8_4_;
                        auStack_43c._0_4_ = auVar6._12_4_;
                        pCVar16 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
                        SVar54 = SampledSpectrum::operator/
                                           ((SampledSpectrum *)local_448,
                                            FVar23 * fVar2 * pCVar16->pdf);
                        SVar55 = SampledWavelengths::PDF(&lambda);
                        SVar54 = SafeDiv(SVar54,SVar55);
                        local_448._0_8_ =
                             *(uintptr_t *)
                              (((this_00->
                                super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                                ).bits & 0xffffffffffff) + 0x340);
                        pCVar16 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
                        FilmHandle::AddSplat
                                  ((FilmHandle *)local_448,&pCVar16->pRaster,SVar54,&lambda);
                      }
                    }
                  }
                }
              }
              pstd::optional<pbrt::CameraWiSample>::~optional(&cs);
            }
            pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
            local_448._0_4_ = (pLVar14->ray).o.super_Tuple3<pbrt::Point3,_float>.x;
            local_448._4_4_ = (pLVar14->ray).o.super_Tuple3<pbrt::Point3,_float>.y;
            uVar8 = *(undefined8 *)&(pLVar14->ray).o.super_Tuple3<pbrt::Point3,_float>.z;
            uVar7 = (pLVar14->ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
            uVar13 = *(ulong *)&(pLVar14->ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
            fStack_434 = (float)uVar13;
            FStack_430 = (Float)(uVar13 >> 0x20);
            local_448._8_4_ = (undefined4)uVar8;
            auStack_43c._0_4_ = (undefined4)((ulong)uVar8 >> 0x20);
            local_428.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                     )(pLVar14->ray).medium.
                      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                      .bits;
            local_420 = local_420 & 0xffffff00;
            fStack_41c = 0.0;
            uStack_3fc._0_4_ = 0.0;
            uStack_3fc._4_4_ = 0.0;
            uStack_3f4._0_4_ = 0.0;
            uStack_3f4._4_4_ = 0.0;
            uStack_418._0_4_ = 0.0;
            uStack_418._4_4_ = 0.0;
            fStack_410 = 0.0;
            fStack_40c = 0.0;
            fStack_408 = 0.0;
            fStack_404 = 0.0;
            fStack_400 = 0.0;
            auVar53 = ZEXT856(uVar13);
            auStack_43c._4_4_ = uVar7;
            pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
            this_02 = pstd::optional<pbrt::LightLeSample>::value(&les);
            FVar23 = LightLeSample::AbsCosTheta(this_02,(Vector3f *)auStack_43c);
            auVar39 = extraout_var_00;
            SVar54 = SampledSpectrum::operator*(&pLVar14->L,FVar23);
            auVar43._0_8_ = SVar54.values.values._8_8_;
            auVar43._8_56_ = auVar53;
            auVar29._0_8_ = SVar54.values.values._0_8_;
            auVar29._8_56_ = auVar39;
            cs.optionalValue._0_16_ = vmovlhps_avx(auVar29._0_16_,auVar43._0_16_);
            pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
            fVar3 = pLVar14->pdfPos;
            pLVar14 = pstd::optional<pbrt::LightLeSample>::value(&les);
            auVar39 = (undefined1  [56])0x0;
            SVar54 = SampledSpectrum::operator/
                               ((SampledSpectrum *)&cs,fVar3 * fVar2 * pLVar14->pdfDir);
            auVar44._0_8_ = SVar54.values.values._8_8_;
            auVar44._8_56_ = auVar53;
            auVar30._0_8_ = SVar54.values.values._0_8_;
            auVar30._8_56_ = auVar39;
            beta.values.values = (array<float,_4>)vmovlhps_avx(auVar30._0_16_,auVar44._0_16_);
            iVar21 = 0;
            do {
              Integrator::Intersect
                        ((optional<pbrt::ShapeIntersection> *)&cs,(Integrator *)this,
                         (Ray *)local_448,INFINITY);
              bVar22 = 1;
              if (local_38 != false) {
                this_03 = pstd::optional<pbrt::ShapeIntersection>::value
                                    ((optional<pbrt::ShapeIntersection> *)&cs);
                local_3c8.
                super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                         )(this_00->
                          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                          ).bits;
                local_3d0 = (sampler->
                            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                            ).bits;
                SurfaceInteraction::GetBSDF
                          (&bsdf,&this_03->intr,(RayDifferential *)local_448,&lambda,&local_3c8,
                           scratchBuffer,(SamplerHandle)&local_3d0);
                if ((CONCAT44(bsdf.bxdf.
                              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                              .bits._4_4_,
                              (undefined4)
                              bsdf.bxdf.
                              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                              .bits) & 0xffffffffffff) == 0) {
                  pSVar20 = pstd::optional<pbrt::ShapeIntersection>::value
                                      ((optional<pbrt::ShapeIntersection> *)&cs);
                  SurfaceInteraction::SkipIntersection
                            (&this_03->intr,(RayDifferential *)local_448,pSVar20->tHit);
                  bVar22 = 0;
                }
                else {
                  iVar11 = iVar21 + 1;
                  bVar22 = 1;
                  bVar10 = iVar21 != this->maxDepth;
                  iVar21 = iVar11;
                  if (bVar10) {
                    pVVar1 = &(this_03->intr).super_Interaction.wo;
                    woRender = pVVar1->super_Tuple3<pbrt::Vector3,_float>;
                    TVar9 = pVVar1->super_Tuple3<pbrt::Vector3,_float>;
                    PVar25 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                             ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                                       ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                         *)sampler);
                    CameraHandle::SampleWi
                              ((optional<pbrt::CameraWiSample> *)&Le,this_00,(Interaction *)this_03,
                               PVar25,&lambda);
                    if (local_140 == true) {
                      pCVar16 = pstd::optional<pbrt::CameraWiSample>::value
                                          ((optional<pbrt::CameraWiSample> *)&Le);
                      if ((pCVar16->pdf != 0.0) || (NAN(pCVar16->pdf))) {
                        pCVar16 = pstd::optional<pbrt::CameraWiSample>::value
                                            ((optional<pbrt::CameraWiSample> *)&Le);
                        auVar53 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                        auVar39 = ZEXT856(0);
                        SVar54 = BSDF::f(&bsdf,(Vector3f)TVar9,
                                         (Vector3f)(pCVar16->wi).super_Tuple3<pbrt::Vector3,_float>,
                                         Importance);
                        auVar45._0_8_ = SVar54.values.values._8_8_;
                        auVar45._8_56_ = auVar53;
                        auVar31._0_8_ = SVar54.values.values._0_8_;
                        auVar31._8_56_ = auVar39;
                        local_300.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar31._0_16_,auVar45._0_16_);
                        auVar39 = ZEXT856(local_300.values.values._8_8_);
                        SVar54 = SampledSpectrum::operator*(&beta,&local_300);
                        auVar46._0_8_ = SVar54.values.values._8_8_;
                        auVar46._8_56_ = auVar53;
                        auVar32._0_8_ = SVar54.values.values._0_8_;
                        auVar32._8_56_ = auVar39;
                        local_2f0.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar32._0_16_,auVar46._0_16_);
                        pCVar16 = pstd::optional<pbrt::CameraWiSample>::value
                                            ((optional<pbrt::CameraWiSample> *)&Le);
                        tVar24 = AbsDot<float>(&pCVar16->wi,&(this_03->intr).shading.n);
                        auVar39 = extraout_var_01;
                        SVar54 = SampledSpectrum::operator*(&local_2f0,tVar24);
                        auVar47._0_8_ = SVar54.values.values._8_8_;
                        auVar47._8_56_ = auVar53;
                        auVar33._0_8_ = SVar54.values.values._0_8_;
                        auVar33._8_56_ = auVar39;
                        local_3e0.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar33._0_16_,auVar47._0_16_);
                        auVar39 = ZEXT856(local_3e0.values.values._8_8_);
                        pCVar16 = pstd::optional<pbrt::CameraWiSample>::value
                                            ((optional<pbrt::CameraWiSample> *)&Le);
                        SVar54 = SampledSpectrum::operator*(&local_3e0,&pCVar16->Wi);
                        auVar48._0_8_ = SVar54.values.values._8_8_;
                        auVar48._8_56_ = auVar53;
                        auVar34._0_8_ = SVar54.values.values._0_8_;
                        auVar34._8_56_ = auVar39;
                        bs.optionalValue._0_16_ = vmovlhps_avx(auVar34._0_16_,auVar48._0_16_);
                        pCVar16 = pstd::optional<pbrt::CameraWiSample>::value
                                            ((optional<pbrt::CameraWiSample> *)&Le);
                        auVar39 = (undefined1  [56])0x0;
                        SVar54 = SampledSpectrum::operator/((SampledSpectrum *)&bs,pCVar16->pdf);
                        auVar49._0_8_ = SVar54.values.values._8_8_;
                        auVar49._8_56_ = auVar53;
                        auVar35._0_8_ = SVar54.values.values._0_8_;
                        auVar35._8_56_ = auVar39;
                        local_4c8 = auVar35._0_16_;
                        auVar6 = vmovlhps_avx(local_4c8,auVar49._0_16_);
                        local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar6._0_8_
                        ;
                        local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = auVar6._8_4_;
                        local_398.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar6._12_4_;
                        SVar54 = SampledWavelengths::PDF(&lambda);
                        auVar6 = local_4c8;
                        uStack_460 = auVar53._0_8_;
                        SVar55.values.values[2] = (float)(int)auVar49._0_8_;
                        SVar55.values.values[3] = (float)(int)((ulong)auVar49._0_8_ >> 0x20);
                        SVar55.values.values[0] = (float)local_4c8._0_4_;
                        SVar55.values.values[1] = (float)local_4c8._4_4_;
                        auVar53 = ZEXT856(uStack_460);
                        auVar39 = ZEXT856((ulong)local_4c8._8_8_);
                        local_4c8 = auVar6;
                        SVar54 = SafeDiv(SVar55,SVar54);
                        auVar50._0_8_ = SVar54.values.values._8_8_;
                        auVar50._8_56_ = auVar53;
                        auVar36._0_8_ = SVar54.values.values._0_8_;
                        auVar36._8_56_ = auVar39;
                        auVar6 = vmovlhps_avx(auVar36._0_16_,auVar50._0_16_);
                        local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar6._0_8_
                        ;
                        local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = auVar6._8_4_;
                        local_398.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar6._12_4_;
                        bVar10 = SampledSpectrum::operator_cast_to_bool
                                           ((SampledSpectrum *)&local_398);
                        if (bVar10) {
                          pCVar16 = pstd::optional<pbrt::CameraWiSample>::value
                                              ((optional<pbrt::CameraWiSample> *)&Le);
                          pCVar17 = pstd::optional<pbrt::CameraWiSample>::value
                                              ((optional<pbrt::CameraWiSample> *)&Le);
                          bVar10 = Integrator::Unoccluded
                                             ((Integrator *)this,&pCVar16->pRef,&pCVar17->pLens);
                          if (bVar10) {
                            bs.optionalValue._0_8_ =
                                 *(undefined8 *)
                                  (((this_00->
                                    super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                                    ).bits & 0xffffffffffff) + 0x340);
                            pCVar16 = pstd::optional<pbrt::CameraWiSample>::value
                                                ((optional<pbrt::CameraWiSample> *)&Le);
                            SVar54.values.values[2] =
                                 local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
                            SVar54.values.values[0] =
                                 local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
                            SVar54.values.values[1] =
                                 local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
                            SVar54.values.values[3] =
                                 local_398.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
                            FilmHandle::AddSplat((FilmHandle *)&bs,&pCVar16->pRaster,SVar54,&lambda)
                            ;
                          }
                        }
                      }
                    }
                    FVar23 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                             ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                                       ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                         *)sampler);
                    local_4c8._0_4_ = FVar23;
                    PVar25 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                             ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                                       ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                         *)sampler);
                    auVar39 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                    BSDF::Sample_f(&bs,&bsdf,(Vector3f)woRender,(Float)local_4c8._0_4_,PVar25,
                                   Importance,All);
                    bVar10 = bs.set;
                    if (bs.set != false) {
                      pBVar18 = pstd::optional<pbrt::BSDFSample>::value(&bs);
                      pBVar19 = pstd::optional<pbrt::BSDFSample>::value(&bs);
                      tVar24 = AbsDot<float>(&pBVar19->wi,&(this_03->intr).shading.n);
                      auVar53 = extraout_var_02;
                      SVar54 = SampledSpectrum::operator*(&pBVar18->f,tVar24);
                      auVar51._0_8_ = SVar54.values.values._8_8_;
                      auVar51._8_56_ = auVar39;
                      auVar37._0_8_ = SVar54.values.values._0_8_;
                      auVar37._8_56_ = auVar53;
                      local_3e0.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar37._0_16_,auVar51._0_16_);
                      pBVar18 = pstd::optional<pbrt::BSDFSample>::value(&bs);
                      auVar53 = (undefined1  [56])0x0;
                      SVar54 = SampledSpectrum::operator/(&local_3e0,pBVar18->pdf);
                      auVar52._0_8_ = SVar54.values.values._8_8_;
                      auVar52._8_56_ = auVar39;
                      auVar38._0_8_ = SVar54.values.values._0_8_;
                      auVar38._8_56_ = auVar53;
                      auVar6 = vmovlhps_avx(auVar38._0_16_,auVar52._0_16_);
                      local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar6._0_8_;
                      local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = auVar6._8_4_;
                      local_398.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar6._12_4_;
                      SampledSpectrum::operator*=(&beta,(SampledSpectrum *)&local_398);
                      pBVar18 = pstd::optional<pbrt::BSDFSample>::value(&bs);
                      TVar9 = (pBVar18->wi).super_Tuple3<pbrt::Vector3,_float>;
                      pBVar18 = pstd::optional<pbrt::BSDFSample>::value(&bs);
                      flags = pBVar18->flags;
                      pBVar18 = pstd::optional<pbrt::BSDFSample>::value(&bs);
                      SurfaceInteraction::SpawnRay
                                (&local_398,&this_03->intr,(RayDifferential *)local_448,&bsdf,
                                 (Vector3f)TVar9,flags,pBVar18->eta);
                      auStack_43c._4_4_ = local_398.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y
                      ;
                      fStack_434 = local_398.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
                      FStack_430 = local_398.super_Ray.time;
                      local_448._0_4_ = local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
                      local_448._4_4_ = local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
                      local_448._8_4_ = local_398.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
                      auStack_43c._0_4_ = local_398.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x
                      ;
                      local_428.
                      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                      .bits = local_398.super_Ray.medium.
                              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                              .bits;
                      fStack_400 = local_398.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y;
                      uStack_3fc._0_4_ = local_398.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
                      uStack_3fc._4_4_ = local_398.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x;
                      uStack_3f4._0_4_ = local_398.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y;
                      uStack_3f4._4_4_ = local_398.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
                      local_420 = local_398._40_4_;
                      fStack_41c = local_398.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
                      uStack_418._0_4_ = local_398.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y;
                      uStack_418._4_4_ = local_398.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z;
                      fStack_410 = local_398.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x;
                      fStack_40c = local_398.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y;
                      fStack_408 = local_398.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z;
                      fStack_404 = local_398.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x;
                    }
                    bVar22 = bVar10 ^ 1;
                    pstd::optional<pbrt::BSDFSample>::~optional(&bs);
                    pstd::optional<pbrt::CameraWiSample>::~optional
                              ((optional<pbrt::CameraWiSample> *)&Le);
                  }
                }
              }
              pstd::optional<pbrt::ShapeIntersection>::~optional
                        ((optional<pbrt::ShapeIntersection> *)&cs);
            } while (bVar22 == 0);
          }
        }
      }
    }
    pstd::optional<pbrt::LightLeSample>::~optional(&les);
  }
  pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
  return;
}

Assistant:

void LightPathIntegrator::EvaluatePixelSample(Point2i pPixel, int sampleIndex,
                                              SamplerHandle sampler,
                                              ScratchBuffer &scratchBuffer) {
    // Sample wavelengths for the ray
    Float lu = sampler.Get1D();
    if (Options->disableWavelengthJitter)
        lu = 0.5;
    SampledWavelengths lambda = camera.GetFilm().SampleWavelengths(lu);

    // Sample light to start light path
    pstd::optional<SampledLight> sampledLight = lightSampler->Sample(sampler.Get1D());
    if (!sampledLight)
        return;
    LightHandle light = sampledLight->light;
    Float lightPDF = sampledLight->pdf;

    // Sample point on light source for light path
    Float time = camera.SampleTime(sampler.Get1D());
    Point2f ul0 = sampler.Get2D();
    Point2f ul1 = sampler.Get2D();
    pstd::optional<LightLeSample> les = light.SampleLe(ul0, ul1, lambda, time);
    if (!les || les->pdfPos == 0 || les->pdfDir == 0 || !les->L)
        return;

    // Add contribution of directly-visible light source
    if (les->intr) {
        pstd::optional<CameraWiSample> cs =
            camera.SampleWi(*les->intr, sampler.Get2D(), lambda);
        if (cs && cs->pdf != 0) {
            if (Float pdf = light.PDF_Li(cs->pLens, cs->wi); pdf > 0) {
                // Add light's emitted radiance if non-zero and light is visible
                SampledSpectrum Le =
                    light.L(les->intr->p(), les->intr->n, les->intr->uv, cs->wi, lambda);
                if (Le && Unoccluded(cs->pRef, cs->pLens)) {
                    // Compute visible light's path contribution and add to film
                    SampledSpectrum L = Le * les->AbsCosTheta(cs->wi) * cs->Wi /
                                        (lightPDF * pdf * cs->pdf);
                    L = SafeDiv(L, lambda.PDF());
                    camera.GetFilm().AddSplat(cs->pRaster, L, lambda);
                }
            }
        }
    }

    // Follow light path and accumulate contributions to image
    int depth = 0;
    // Initialize light path ray and weighted path throughput _beta_
    RayDifferential ray(les->ray);
    SampledSpectrum beta =
        les->L * les->AbsCosTheta(ray.d) / (lightPDF * les->pdfPos * les->pdfDir);

    while (true) {
        // Intersect light path ray with scene
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        if (!si)
            break;
        SurfaceInteraction &isect = si->intr;

        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Splat contribution into film if intersection point is visible to camera
        Vector3f wo = isect.wo;
        pstd::optional<CameraWiSample> cs =
            camera.SampleWi(isect, sampler.Get2D(), lambda);
        if (cs && cs->pdf != 0) {
            SampledSpectrum L = beta * bsdf.f(wo, cs->wi, TransportMode::Importance) *
                                AbsDot(cs->wi, isect.shading.n) * cs->Wi / cs->pdf;
            L = SafeDiv(L, lambda.PDF());
            if (L && Unoccluded(cs->pRef, cs->pLens))
                camera.GetFilm().AddSplat(cs->pRaster, L, lambda);
        }

        // Sample BSDF and update light path state
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs =
            bsdf.Sample_f(wo, u, sampler.Get2D(), TransportMode::Importance);
        if (!bs)
            break;
        beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);
    }
}